

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::FunctionPointerPrinter::PrintValue<void(void_const*,unsigned_long),void>
               (_func_void_void_ptr_unsigned_long *p,ostream *os)

{
  ostream *os_local;
  _func_void_void_ptr_unsigned_long *p_local;
  
  if (p == (_func_void_void_ptr_unsigned_long *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::ostream::operator<<(os,p);
  }
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is a function type, so '*os << p' doesn't do what we want
      // (it just prints p as bool).  We want to print p as a const
      // void*.
      *os << reinterpret_cast<const void*>(p);
    }
  }